

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

DefinitionLookupResult * __thiscall
slang::ast::Compilation::getDefinition
          (Compilation *this,string_view name,Scope *scope,SourceRange sourceRange,
          BindDirectiveInfo *bindInfo)

{
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  string_view name_00;
  SourceRange sourceRange_02;
  string_view name_01;
  bool bVar1;
  uint n_;
  ModuleDeclarationSyntax *pMVar2;
  DefinitionSymbol *pDVar3;
  size_t sVar4;
  equal_to<const_slang::syntax::SyntaxNode_*> *this_00;
  raw_key_type *ppSVar5;
  pointer ppVar6;
  SyntaxNode **ppSVar7;
  group_type *pgVar8;
  value_type *pvVar9;
  ConfigRule *pCVar10;
  SourceLocation in_RCX;
  Symbol **ppSVar11;
  SourceLocation in_RDX;
  Scope *in_RSI;
  DefinitionLookupResult *in_RDI;
  long in_R9;
  iterator iVar12;
  size_t in_stack_00000008;
  char *in_stack_00000010;
  const_iterator it_1;
  const_iterator it;
  ModuleDeclarationSyntax *mds;
  size_t hash;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  *in_stack_fffffffffffffcb0;
  equal_to<const_slang::syntax::SyntaxNode_*> *in_stack_fffffffffffffcb8;
  SyntaxNode *syntax;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  Scope *in_stack_fffffffffffffd90;
  Compilation *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  size_t in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  DiagCode in_stack_fffffffffffffdd0;
  Scope *this_01;
  undefined8 in_stack_fffffffffffffe00;
  DiagCode DVar13;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_1c0;
  SyntaxNode **local_1b0;
  Symbol **local_1a8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_1a0;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_190;
  SyntaxNode **local_180;
  Symbol **local_178;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_170;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
  local_160;
  SyntaxNode **local_148;
  Symbol **local_140;
  iterator local_138;
  undefined1 local_128 [16];
  ModuleDeclarationSyntax *in_stack_fffffffffffffee8;
  Scope *in_stack_fffffffffffffef0;
  Compilation *in_stack_fffffffffffffef8;
  char_pointer local_100;
  table_element_pointer local_f8;
  uint local_a4;
  pow2_quadratic_prober local_90;
  size_t local_80;
  size_t local_78;
  SyntaxNode **local_70;
  Symbol **local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SyntaxNode **local_10;
  Symbol **local_8;
  
  DVar13 = SUB84((ulong)in_stack_fffffffffffffe00 >> 0x20,0);
  this_01 = in_RSI;
  DefinitionLookupResult::DefinitionLookupResult(in_RDI);
  if (*(long *)(in_R9 + 0x18) == 0) {
    in_stack_fffffffffffffca8 = 0xcf0006;
    name_00._M_str = in_stack_fffffffffffffdb8;
    name_00._M_len = in_stack_fffffffffffffdb0;
    sourceRange_01.endLoc._0_4_ = in_stack_fffffffffffffda8;
    sourceRange_01.startLoc = (SourceLocation)in_stack_fffffffffffffda0;
    sourceRange_01.endLoc._4_4_ = in_stack_fffffffffffffdac;
    errorMissingDef(in_stack_fffffffffffffd98,name_00,(Scope *)in_RCX,sourceRange_01,
                    in_stack_fffffffffffffdd0);
  }
  else {
    in_stack_fffffffffffffd0c = **(int **)(in_R9 + 0x18);
    if (((in_stack_fffffffffffffd0c == 0x103) || (in_stack_fffffffffffffd0c == 0x134)) ||
       (in_stack_fffffffffffffd0c == 0x17c)) {
      pMVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ModuleDeclarationSyntax>
                         (*(SyntaxNode **)(in_R9 + 0x18));
      DVar13 = SUB84(pMVar2,0);
      pDVar3 = getDefinition(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
      in_RDI->definition = &pDVar3->super_Symbol;
      if (in_RDI->definition == (Symbol *)0x0) {
        name_01._M_str = in_stack_00000010;
        name_01._M_len = in_stack_00000008;
        in_stack_fffffffffffffca8 = 0xcf0006;
        sourceRange_00.endLoc._0_4_ = in_stack_fffffffffffffda8;
        sourceRange_00.startLoc = (SourceLocation)in_stack_fffffffffffffda0;
        sourceRange_00.endLoc._4_4_ = 0xcf0006;
        errorMissingDef(in_stack_fffffffffffffd98,name_01,in_stack_fffffffffffffd90,sourceRange_00,
                        DVar13);
      }
    }
    else {
      sourceRange_02.endLoc = in_RCX;
      sourceRange_02.startLoc = in_RDX;
      Scope::addDiag(this_01,DVar13,sourceRange_02);
    }
  }
  syntax = (SyntaxNode *)&in_RSI[0x32].lastMember;
  local_1b0 = (SyntaxNode **)(in_R9 + 0x10);
  local_1a8 = (Symbol **)syntax;
  sVar4 = boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
          ::hash_for<slang::syntax::SyntaxNode_const*>
                    (in_stack_fffffffffffffcb0,
                     (SyntaxNode **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_18 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
             ::position_for(in_stack_fffffffffffffcb0,
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_20 = sVar4;
  local_10 = (SyntaxNode **)(in_R9 + 0x10);
  local_8 = (Symbol **)syntax;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
  do {
    local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
    local_40 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
               ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                         *)0x52768e);
    local_40 = local_40 + local_38;
    local_44 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0);
    if (local_44 != 0) {
      local_50 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                 ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                             *)0x5276d9);
      local_58 = local_50 + local_38 * 0xf;
      do {
        local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        this_00 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                          *)0x527729);
        ppSVar7 = local_10;
        ppSVar5 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                  ::
                  key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>
                            ((pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>
                              *)0x527756);
        bVar1 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                          (this_00,ppSVar7,ppSVar5);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
          ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
                           *)local_128,local_40,local_5c,local_58 + local_5c);
          goto LAB_0052784a;
        }
        local_44 = local_44 - 1 & local_44;
      } while (local_44 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffcb0,
                              CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    if (bVar1) {
      memset(local_128,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
      ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
                       *)local_128);
      goto LAB_0052784a;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_30,(size_t)syntax->parent);
  } while (bVar1);
  memset(local_128,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
  ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
                   *)local_128);
LAB_0052784a:
  iVar12 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
           ::make_iterator((locator *)0x527857);
  local_100 = iVar12.pc_;
  local_f8 = iVar12.p_;
  local_1c0.pc_ = local_100;
  local_1c0.p_ = local_f8;
  boost::unordered::detail::foa::
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  ::table_iterator<false,_nullptr>(&local_1a0,&local_1c0);
  boost::unordered::
  unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
  ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
         *)0x5278f0);
  bVar1 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffcb0,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  if (bVar1) {
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)in_stack_fffffffffffffcb0);
    in_RDI->configRoot = ppVar6->second;
  }
  ppSVar11 = &in_RSI[0x32].lastMember;
  ppSVar7 = (SyntaxNode **)(in_R9 + 8);
  local_180 = ppSVar7;
  local_178 = ppSVar11;
  local_148 = ppSVar7;
  local_140 = ppSVar11;
  sVar4 = boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
          ::hash_for<slang::syntax::SyntaxNode_const*>
                    (in_stack_fffffffffffffcb0,
                     (SyntaxNode **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_78 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
             ::position_for(in_stack_fffffffffffffcb0,
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_80 = sVar4;
  local_70 = ppSVar7;
  local_68 = ppSVar11;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_90,local_78);
  while( true ) {
    sVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_90);
    pgVar8 = boost::unordered::detail::foa::
             table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
             ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                       *)0x527a7a);
    local_a4 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match((group15<boost::unordered::detail::foa::plain_integral> *)
                       in_stack_fffffffffffffcb8,(size_t)in_stack_fffffffffffffcb0);
    if (local_a4 != 0) {
      pvVar9 = boost::unordered::detail::foa::
               table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
               ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                           *)0x527ac5);
      do {
        n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_fffffffffffffcb8 =
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                     *)0x527b15);
        ppSVar7 = local_70;
        ppSVar5 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::ConfigBlockSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>>
                  ::
                  key_from<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::ConfigBlockSymbol_const*>>
                            ((pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>
                              *)0x527b42);
        bVar1 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                          (in_stack_fffffffffffffcb8,ppSVar7,ppSVar5);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
          ::table_locator(&local_160,pgVar8 + sVar4,n_,pvVar9 + sVar4 * 0xf + (ulong)n_);
          goto LAB_00527c36;
        }
        local_a4 = local_a4 - 1 & local_a4;
      } while (local_a4 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffcb0,
                              CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    if (bVar1) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_90,*(size_t *)&in_RSI[0x32].deferredMemberIndex);
    if (!bVar1) {
      memset(&local_160,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
      ::table_locator(&local_160);
LAB_00527c36:
      local_138 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
                  ::make_iterator((locator *)0x527c43);
      local_190.pc_ = local_138.pc_;
      local_190.p_ = local_138.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_170,&local_190);
      boost::unordered::
      unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
      ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>_>
             *)0x527cdc);
      bVar1 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffcb0,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      if (bVar1) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_const_slang::ast::ConfigBlockSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffcb0);
        pCVar10 = ConfigBlockSymbol::findRuleFromSyntax
                            ((ConfigBlockSymbol *)
                             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),syntax);
        in_RDI->configRule = pCVar10;
      }
      return in_RDI;
    }
  }
  memset(&local_160,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_const_slang::ast::ConfigBlockSymbol_*>_>
  ::table_locator(&local_160);
  goto LAB_00527c36;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::getDefinition(
    std::string_view name, const Scope& scope, SourceRange sourceRange,
    const BindDirectiveInfo& bindInfo) const {

    DefinitionLookupResult result;
    if (bindInfo.instantiationDefSyntax) {
        switch (bindInfo.instantiationDefSyntax->kind) {
            case SyntaxKind::ModuleDeclaration:
            case SyntaxKind::InterfaceDeclaration:
            case SyntaxKind::ProgramDeclaration: {
                auto& mds = bindInfo.instantiationDefSyntax->as<ModuleDeclarationSyntax>();
                result.definition = getDefinition(scope, mds);
                if (!result.definition)
                    errorMissingDef(name, scope, sourceRange, diag::UnknownModule);
                break;
            }
            case SyntaxKind::UdpDeclaration:
                scope.addDiag(diag::BindTargetPrimitive, sourceRange);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }
    else {
        errorMissingDef(name, scope, sourceRange, diag::UnknownModule);
    }

    if (auto it = configBySyntax.find(bindInfo.configBlockSyntax); it != configBySyntax.end())
        result.configRoot = it->second;

    if (auto it = configBySyntax.find(bindInfo.configRuleSyntax); it != configBySyntax.end()) {
        // This rule maps to a config block, so map further to the actual rule object.
        result.configRule = it->second->findRuleFromSyntax(*bindInfo.configRuleSyntax);
    }

    return result;
}